

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowCleanMarkB_rec(Aig_Obj_t *pObj)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)&pObj->field_0x18;
  while( true ) {
    if ((uVar1 & 0x20) == 0) {
      return;
    }
    *(ulong *)&pObj->field_0x18 = uVar1 & 0xffffffffffffffdf;
    if (((uint)uVar1 & 7) - 7 < 0xfffffffe) break;
    Llb_ManFlowCleanMarkB_rec((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    uVar1 = *(ulong *)&pObj->field_0x18;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x391,"void Llb_ManFlowCleanMarkB_rec(Aig_Obj_t *)");
}

Assistant:

void Llb_ManFlowCleanMarkB_rec( Aig_Obj_t * pObj )
{
    if ( pObj->fMarkB == 0 )
        return;
    pObj->fMarkB = 0;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowCleanMarkB_rec( Aig_ObjFanin0(pObj) );
    Llb_ManFlowCleanMarkB_rec( Aig_ObjFanin1(pObj) );
}